

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void handle_queued_messages(CManager cm,void *vmaster)

{
  char cVar1;
  EVmaster_msg_type EVar2;
  FILE *pFVar3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  EVmaster_msg *msg;
  _EVmaster_msg **pp_Var7;
  timespec ts;
  
  if (*(long *)((long)vmaster + 0x20) != 0) {
    iVar4 = CManager_locked(cm);
    if (iVar4 == 0) {
      __assert_fail("CManager_locked(cm)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                    ,0xfc,"void handle_queued_messages(CManager, void *)");
    }
    msg = *(EVmaster_msg **)((long)vmaster + 0x20);
    while (msg != (EVmaster_msg *)0x0) {
      iVar4 = CMtrace_val[0xd];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(cm,EVdfgVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar3 = (FILE *)cm->CMTrace_file;
          _Var5 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"EVDFG handle_queued_messages -  master DFG state is %s\n",
                str_state[*(uint *)((long)vmaster + 0x30)]);
      }
      fflush((FILE *)cm->CMTrace_file);
      EVar2 = msg->msg_type;
      cVar1 = action_model[*(uint *)((long)vmaster + 0x30)][EVar2];
      if (cVar1 == 'U') {
        printf("Master Message is type %s, UNEXPECTED!  Discarding...\n",master_msg_str[EVar2]);
LAB_00143ba0:
        *(_EVmaster_msg **)((long)vmaster + 0x20) = msg->next;
LAB_00143c7c:
        free_master_msg(msg);
        pp_Var7 = (_EVmaster_msg **)((long)vmaster + 0x20);
      }
      else {
        if (cVar1 == 'I') goto LAB_00143ba0;
        if (cVar1 != 'Q') {
          if (cVar1 != 'H') {
            printf("Unexpected action type \'%c\', discarding\n",(ulong)(uint)(int)cVar1);
            goto LAB_00143ba0;
          }
          iVar4 = CMtrace_val[0xd];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar4 = CMtrace_init(cm,EVdfgVerbose);
          }
          if (iVar4 != 0) {
            if (CMtrace_PID != 0) {
              pFVar3 = (FILE *)cm->CMTrace_file;
              _Var5 = getpid();
              pVar6 = pthread_self();
              fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar6);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&ts);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
            }
            fprintf((FILE *)cm->CMTrace_file,"Master Message is type %s, calling handler\n",
                    master_msg_str[msg->msg_type]);
          }
          fflush((FILE *)cm->CMTrace_file);
          *(_EVmaster_msg **)((long)vmaster + 0x20) = msg->next;
          (*master_msg_handler[msg->msg_type])((EVmaster)vmaster,msg);
          goto LAB_00143c7c;
        }
        printf("Master Message is type %s, not appropriate now, leaving queued...\n",
               master_msg_str[EVar2]);
        pp_Var7 = &msg->next;
      }
      msg = *pp_Var7;
      iVar4 = CMtrace_val[0xd];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(cm,EVdfgVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar3 = (FILE *)cm->CMTrace_file;
          _Var5 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,
                "EVDFG handle queued end loop -  master DFG state is now %s\n",
                str_state[*(uint *)((long)vmaster + 0x30)]);
      }
      fflush((FILE *)cm->CMTrace_file);
    }
    iVar4 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar3 = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"EVDFG handle queued exiting -  master DFG state is now %s\n"
              ,str_state[*(uint *)((long)vmaster + 0x30)]);
    }
    fflush((FILE *)cm->CMTrace_file);
  }
  return;
}

Assistant:

static void
handle_queued_messages(CManager cm, void* vmaster)
{
    /* SHOULD */
    /*  1 - consolidate node failure messages (likely to get several for each node) and handle these first */
    /*  2 -  handle node join messages last */
    /* FOR THE MOMENT */
    /* just do everything in order */
    /* beware the the list might change while we're running a handler */
    EVmaster master = (EVmaster) vmaster;
    EVmaster_msg_ptr next;
    EVmaster_msg_ptr *last_ptr;

    if (master->queued_messages == NULL) return;
    assert(CManager_locked(cm));
    next = master->queued_messages;
    last_ptr = &master->queued_messages;
    while(next != NULL) {
	CMtrace_out(cm, EVdfgVerbose, "EVDFG handle_queued_messages -  master DFG state is %s\n", str_state[master->state]);
	switch (action_model[master->state][next->msg_type]) {
	case 'H':
	    CMtrace_out(cm, EVdfgVerbose, "Master Message is type %s, calling handler\n", master_msg_str[next->msg_type]);
	    *last_ptr = next->next;  /* remove msg from queue */
	    (*master_msg_handler[next->msg_type])(master, next);
	    free_master_msg(next);
	    next = master->queued_messages;   /* start from scratch in case state changed */
	    break;
	case 'U':
	    printf("Master Message is type %s, UNEXPECTED!  Discarding...\n", master_msg_str[next->msg_type]);
	    *last_ptr = next->next;  /* remove msg from queue */
	    free_master_msg(next);
	    next = *last_ptr;
	    break;
	case 'Q':
	    printf("Master Message is type %s, not appropriate now, leaving queued...\n", master_msg_str[next->msg_type]);
	    next = next->next;
	    break;
	default:
	    printf("Unexpected action type '%c', discarding\n", action_model[master->state][next->msg_type]);
	    /* falling through */
	case 'I':
	    *last_ptr = next->next;  /* remove msg from queue */
	    free_master_msg(next);
	    next = *last_ptr;
	    break;
	}
	CMtrace_out(cm, EVdfgVerbose, "EVDFG handle queued end loop -  master DFG state is now %s\n", str_state[master->state]);
    }	    
    CMtrace_out(cm, EVdfgVerbose, "EVDFG handle queued exiting -  master DFG state is now %s\n", str_state[master->state]);
}